

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

bool __thiscall
sentencepiece::string_util::lexical_cast<bool>(string_util *this,string_view arg,bool *result)

{
  long *plVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  string lower_value;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,arg._M_len,this + arg._M_len);
  plVar1 = local_50;
  if (local_48 != 0) {
    lVar4 = 0;
    do {
      iVar3 = tolower((int)*(char *)((long)plVar1 + lVar4));
      *(char *)((long)plVar1 + lVar4) = (char)iVar3;
      lVar4 = lVar4 + 1;
    } while (local_48 != lVar4);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_50);
  bVar6 = true;
  if (iVar3 == 0) {
    cVar2 = '\x01';
  }
  else {
    uVar5 = 0;
    do {
      iVar3 = std::__cxx11::string::compare((char *)&local_50);
      if (iVar3 == 0) {
        cVar2 = '\0';
        goto LAB_0020e105;
      }
      bVar6 = uVar5 < 4;
      if (uVar5 == 4) {
        bVar6 = false;
        goto LAB_0020e110;
      }
      iVar3 = std::__cxx11::string::compare((char *)&local_50);
      uVar5 = uVar5 + 1;
    } while (iVar3 != 0);
    cVar2 = '\x01';
  }
LAB_0020e105:
  *arg._M_str = cVar2;
LAB_0020e110:
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return bVar6;
}

Assistant:

inline bool lexical_cast(absl::string_view arg, bool *result) {
  const char *kTrue[] = {"1", "t", "true", "y", "yes"};
  const char *kFalse[] = {"0", "f", "false", "n", "no"};
  std::string lower_value = std::string(arg);
  std::transform(lower_value.begin(), lower_value.end(), lower_value.begin(),
                 ::tolower);
  for (size_t i = 0; i < 5; ++i) {
    if (lower_value == kTrue[i]) {
      *result = true;
      return true;
    } else if (lower_value == kFalse[i]) {
      *result = false;
      return true;
    }
  }

  return false;
}